

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functional.cpp
# Opt level: O0

void __thiscall
Functional::gnunorm(Functional *this,double xsr,double ysr,double dispx,double dispy,int count)

{
  Group local_78;
  undefined1 local_50 [8];
  Group group;
  int count_local;
  double dispy_local;
  double dispx_local;
  double ysr_local;
  double xsr_local;
  Functional *this_local;
  
  group.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = count;
  Group::Group((Group *)local_50);
  Group::make_group((Group *)local_50,xsr,ysr,dispx,dispy,
                    group.points.super__Vector_base<Point,_std::allocator<Point>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_);
  Group::Group(&local_78,(Group *)local_50);
  Field::add(&this->f,&local_78);
  Group::~Group(&local_78);
  Group::~Group((Group *)local_50);
  return;
}

Assistant:

void Functional::gnunorm(double xsr, double ysr, double dispx, double dispy, int count) {
    Group group;
    group.make_group(xsr, ysr, dispx, dispy, count);
    f.add(group);

}